

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::HostAddress::HostAddress(HostAddress *this,string *address)

{
  undefined4 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  HostAddress *this_00;
  
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0;
  IPv6Address::IPv6Address((IPv6Address *)0x1f9e4e);
  this_00 = (HostAddress *)(in_RDI + 6);
  std::__cxx11::string::string((string *)this_00);
  SetAddress(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

HostAddress::HostAddress(const std::string& address)
    : m_protocol(HostAddress::UnknownNetworkProtocol)
    , m_ip4Address(0)
{
    SetAddress(address);
}